

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_rpc_action(lyout *out,int level,lys_node *node)

{
  char *pcVar1;
  lys_node_rpc_action *rpc;
  lys_node *sub;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  pcVar1 = "action";
  if (node->nodetype == LYS_RPC) {
    pcVar1 = "rpc";
  }
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,pcVar1,"name",node->name,0);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,0x73);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[3]; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_typedef(plStack_10,node_local._4_4_,_content->module,
                      (lys_tpdf *)(node[1].name + (long)sub._4_4_ * 0x80));
  }
  for (rpc = (lys_node_rpc_action *)_content->child; rpc != (lys_node_rpc_action *)0x0;
      rpc = (lys_node_rpc_action *)rpc->next) {
    if ((rpc->parent == _content) &&
       (((rpc->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN || ((rpc->flags & 0x40) == 0)))) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)rpc,0xe00);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  pcVar1 = "action";
  if (_content->nodetype == LYS_RPC) {
    pcVar1 = "rpc";
  }
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,pcVar1,(int)sub);
  return;
}

Assistant:

static void
yin_print_rpc_action(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node *sub;
    struct lys_node_rpc_action *rpc = (struct lys_node_rpc_action *)node;

    yin_print_open(out, level, NULL, (node->nodetype == LYS_RPC ? "rpc" : "action"), "name", node->name, content);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT | SNODE_COMMON_IFF |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    for (i = 0; i < rpc->tpdf_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_typedef(out, level, node->module, &rpc->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if ((sub->parent != node) || (((sub->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (sub->flags & LYS_IMPLICIT)))) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_INPUT | LYS_OUTPUT | LYS_GROUPING);
    }

    level--;
    yin_print_close(out, level, NULL, (node->nodetype == LYS_RPC ? "rpc" : "action"), content);
}